

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::ItemSimilarityRecommender::ByteSizeLong(ItemSimilarityRecommender *this)

{
  long lVar1;
  Rep *pRVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  long lVar7;
  size_t sVar8;
  void **ppvVar9;
  
  sVar8 = (size_t)(this->itemitemsimilarities_).super_RepeatedPtrFieldBase.current_size_;
  pRVar2 = (this->itemitemsimilarities_).super_RepeatedPtrFieldBase.rep_;
  ppvVar9 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar9 = (void **)0x0;
  }
  if (sVar8 == 0) {
    sVar8 = 0;
  }
  else {
    lVar1 = sVar8 * 8;
    lVar7 = 0;
    do {
      sVar6 = ItemSimilarityRecommender_SimilarItems::ByteSizeLong
                        (*(ItemSimilarityRecommender_SimilarItems **)((long)ppvVar9 + lVar7));
      uVar5 = (uint)sVar6 | 1;
      iVar4 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar8 = sVar8 + sVar6 + (ulong)(iVar4 * 9 + 0x49U >> 6);
      lVar7 = lVar7 + 8;
    } while (lVar1 - lVar7 != 0);
  }
  lVar1 = *(long *)(((ulong)(this->iteminputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8
                   );
  if (lVar1 != 0) {
    uVar5 = (uint)lVar1 | 1;
    iVar4 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    sVar8 = sVar8 + lVar1 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
  }
  lVar1 = *(long *)(((ulong)(this->numrecommendationsinputfeaturename_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  if (lVar1 != 0) {
    uVar5 = (uint)lVar1 | 1;
    iVar4 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    sVar8 = sVar8 + lVar1 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
  }
  lVar1 = *(long *)(((ulong)(this->itemrestrictioninputfeaturename_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  if (lVar1 != 0) {
    uVar5 = (uint)lVar1 | 1;
    iVar4 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    sVar8 = sVar8 + lVar1 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
  }
  lVar1 = *(long *)(((ulong)(this->itemexclusioninputfeaturename_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  if (lVar1 != 0) {
    uVar5 = (uint)lVar1 | 1;
    iVar4 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    sVar8 = sVar8 + lVar1 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
  }
  lVar1 = *(long *)(((ulong)(this->recommendeditemlistoutputfeaturename_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  if (lVar1 != 0) {
    uVar5 = (uint)lVar1 | 1;
    iVar4 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    sVar8 = sVar8 + lVar1 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 2;
  }
  lVar1 = *(long *)(((ulong)(this->recommendeditemscoreoutputfeaturename_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  if (lVar1 != 0) {
    uVar5 = (uint)lVar1 | 1;
    iVar4 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    sVar8 = sVar8 + lVar1 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 2;
  }
  if (this->itemstringids_ != (StringVector *)0x0 &&
      this != (ItemSimilarityRecommender *)_ItemSimilarityRecommender_default_instance_) {
    sVar6 = StringVector::ByteSizeLong(this->itemstringids_);
    uVar5 = (uint)sVar6 | 1;
    iVar4 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    sVar8 = sVar8 + sVar6 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
  }
  if (this->itemint64ids_ != (Int64Vector *)0x0 &&
      this != (ItemSimilarityRecommender *)_ItemSimilarityRecommender_default_instance_) {
    sVar6 = Int64Vector::ByteSizeLong(this->itemint64ids_);
    uVar5 = (uint)sVar6 | 1;
    iVar4 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    sVar8 = sVar8 + sVar6 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    sVar8 = sVar8 + *(long *)((uVar3 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar8;
  return sVar8;
}

Assistant:

size_t ItemSimilarityRecommender::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ItemSimilarityRecommender)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.ItemSimilarityRecommender.SimilarItems itemItemSimilarities = 1;
  total_size += 1UL * this->_internal_itemitemsimilarities_size();
  for (const auto& msg : this->itemitemsimilarities_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // string itemInputFeatureName = 10;
  if (!this->_internal_iteminputfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_iteminputfeaturename());
  }

  // string numRecommendationsInputFeatureName = 11;
  if (!this->_internal_numrecommendationsinputfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_numrecommendationsinputfeaturename());
  }

  // string itemRestrictionInputFeatureName = 12;
  if (!this->_internal_itemrestrictioninputfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_itemrestrictioninputfeaturename());
  }

  // string itemExclusionInputFeatureName = 13;
  if (!this->_internal_itemexclusioninputfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_itemexclusioninputfeaturename());
  }

  // string recommendedItemListOutputFeatureName = 20;
  if (!this->_internal_recommendeditemlistoutputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_recommendeditemlistoutputfeaturename());
  }

  // string recommendedItemScoreOutputFeatureName = 21;
  if (!this->_internal_recommendeditemscoreoutputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_recommendeditemscoreoutputfeaturename());
  }

  // .CoreML.Specification.StringVector itemStringIds = 2;
  if (this->_internal_has_itemstringids()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *itemstringids_);
  }

  // .CoreML.Specification.Int64Vector itemInt64Ids = 3;
  if (this->_internal_has_itemint64ids()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *itemint64ids_);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}